

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.h
# Opt level: O3

void __thiscall soplex::SPxSteepPR<double>::~SPxSteepPR(SPxSteepPR<double> *this)

{
  ~SPxSteepPR(this);
  operator_delete(this,0x158);
  return;
}

Assistant:

virtual ~SPxSteepPR()
   {}